

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O1

void __thiscall musicBlock::OPLplayNote(musicBlock *this,uint channel,uchar note,int volume)

{
  uint uVar1;
  uint uVar2;
  OP2instrEntry *instrument;
  
  if (volume == 0) {
    OPLreleaseNote(this,channel,note);
    return;
  }
  if (channel == 0xf) {
    if (0xd0 < (byte)(note + 0xae)) {
      uVar1 = note + 0x5d & 0xff;
      goto LAB_00319c73;
    }
  }
  else {
    uVar1 = (this->driverdata).channelInstr[channel];
LAB_00319c73:
    if (this->OPLinstruments != (OP2instrEntry *)0x0) {
      instrument = this->OPLinstruments + uVar1;
      goto LAB_00319c8e;
    }
  }
  instrument = (OP2instrEntry *)0x0;
LAB_00319c8e:
  if (instrument != (OP2instrEntry *)0x0) {
    uVar2 = findFreeChannel(this,(uint)(channel == 0xf) * 2,channel,note);
    if (uVar2 != 0xffffffff) {
      occupyChannel(this,uVar2,channel,(uint)note,volume,instrument,'\0');
      if (((instrument->flags & 4) != 0) && (opl_singlevoice.Value == false)) {
        uVar2 = findFreeChannel(this,(uint)(channel == 0xf) * 2 + 1,channel,note);
        if (uVar2 != 0xffffffff) {
          occupyChannel(this,uVar2,channel,(uint)note,volume,instrument,'\x01');
        }
      }
    }
  }
  return;
}

Assistant:

void musicBlock::OPLplayNote(uint channel, uchar note, int volume)
{
	int i;
	struct OP2instrEntry *instr;

	if (volume == 0)
	{
		OPLreleaseNote (channel, note);
		return;
	}

	if ( (instr = getInstrument(channel, note)) == NULL )
		return;

	if ( (i = findFreeChannel((channel == PERCUSSION) ? 2 : 0, channel, note)) != -1)
	{
		occupyChannel(i, channel, note, volume, instr, 0);
		if ((instr->flags & FL_DOUBLE_VOICE) && !opl_singlevoice)
		{
			if ( (i = findFreeChannel((channel == PERCUSSION) ? 3 : 1, channel, note)) != -1)
				occupyChannel(i, channel, note, volume, instr, 1);
		}
	}
}